

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_13.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  bool bVar2;
  reference piVar3;
  ostream *poVar4;
  int *prime;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  iterator iStack_70;
  int cnt;
  int *local_68;
  const_iterator local_60;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> next;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  iterator it;
  int i;
  int local_2c;
  undefined1 local_28 [4];
  int n;
  vector<int,_std::allocator<int>_> primes;
  
  primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_28);
  local_2c = 0;
  std::operator<<((ostream *)&std::cout,"Enter amount of primes to find:\n");
  std::istream::operator>>((istream *)&std::cin,&local_2c);
  for (it._M_current._0_4_ = 2;
      SBORROW4((int)it._M_current,local_2c * 10) != (int)it._M_current + local_2c * -10 < 0;
      it._M_current._0_4_ = (int)it._M_current + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_28,(value_type *)&it);
  }
  local_48._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_28);
  while( true ) {
    next._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_28);
    bVar2 = __gnu_cxx::operator!=(&local_48,&next);
    if (!bVar2) break;
    local_58 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator++(&local_48,0);
    while( true ) {
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_58);
      iVar1 = *piVar3;
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_48);
      if (iVar1 != *piVar3) {
        piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_58);
        iVar1 = *piVar3;
        piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_48);
        if (iVar1 % *piVar3 == 0) {
          __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
          __normal_iterator<int*>
                    ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_60
                     ,&local_58);
          local_68 = (int *)std::vector<int,_std::allocator<int>_>::erase
                                      ((vector<int,_std::allocator<int>_> *)local_28,local_60);
        }
      }
      iStack_70 = std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)local_28);
      bVar2 = __gnu_cxx::operator==(&local_58,&stack0xffffffffffffff90);
      if (bVar2) break;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_58);
    }
  }
  __range1._4_4_ = 0;
  __end1 = std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)local_28);
  prime = (int *)std::vector<int,_std::allocator<int>_>::end
                           ((vector<int,_std::allocator<int>_> *)local_28);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)&prime), bVar2) {
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar3);
    std::operator<<(poVar4,' ');
    if (__range1._4_4_ == local_2c) break;
    __range1._4_4_ = __range1._4_4_ + 1;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
}

Assistant:

int main()
{
	std::vector<int> primes;
	auto n = 0;
	std::cout << "Enter amount of primes to find:\n";
	std::cin >> n;
	for (auto i = 2; i < n * 10; ++i)
		primes.push_back(i);

	for (auto it = primes.begin(); it != primes.end();)
	{
		auto next = it++;
		for (;;)
		{
			if (*next != *it && *next % *it == 0)
				primes.erase(next);
			if (next == primes.end())
				break;
			++next;
		}
	}

	auto cnt = 0;
	for (auto&& prime : primes)
	{
		std::cout << prime << ' ';
		if (cnt == n)
			break;
		++cnt;
	}
	std::cout << std::endl;
	return 0;
}